

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

size_t __thiscall
pbrt::
HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::FindOffset(HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
             *this,int *key)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  optional<std::pair<int,_int>_> *poVar4;
  pair<int,_int> *ppVar5;
  int nProbes;
  uint uVar6;
  ulong uVar7;
  
  sVar3 = (this->table).nStored;
  iVar1 = *key;
  uVar6 = 0;
  do {
    poVar4 = (this->table).ptr;
    uVar7 = (this->table).nStored - 1 &
            (ulong)(uVar6 * uVar6 >> 1) + (ulong)(uVar6 >> 1) + (sVar3 - 1 & (long)iVar1);
    if (poVar4[uVar7].set != true) {
      return uVar7;
    }
    iVar2 = *key;
    ppVar5 = pstd::optional<std::pair<int,_int>_>::value(poVar4 + uVar7);
    uVar6 = uVar6 + 1;
  } while (iVar2 != ppVar5->first);
  return uVar7;
}

Assistant:

PBRT_CPU_GPU
    size_t FindOffset(const Key &key) const {
        size_t baseOffset = Hash()(key) & (capacity() - 1);
        for (int nProbes = 0;; ++nProbes) {
            // Quadratic probing.
            size_t offset =
                (baseOffset + nProbes / 2 + nProbes * nProbes / 2) & (capacity() - 1);
            if (table[offset].has_value() == false || key == table[offset]->first) {
                return offset;
            }
        }
    }